

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts5PoslistSafeAppend(Fts5Buffer *pBuf,i64 *piPrev,i64 iPos)

{
  long lVar1;
  int iVar2;
  uchar *in_RDX;
  ulong *in_RSI;
  long *in_RDI;
  
  if ((long)*in_RSI <= (long)in_RDX) {
    if (((ulong)in_RDX & 0x7fffffff00000000) != (*in_RSI & 0x7fffffff00000000)) {
      lVar1 = in_RDI[1];
      *(int *)(in_RDI + 1) = (int)lVar1 + 1;
      *(undefined1 *)(*in_RDI + (long)(int)lVar1) = 1;
      iVar2 = sqlite3Fts5PutVarint(in_RDX,0x272939);
      *(int *)(in_RDI + 1) = iVar2 + (int)in_RDI[1];
      *in_RSI = (ulong)in_RDX & 0x7fffffff00000000;
    }
    iVar2 = sqlite3Fts5PutVarint(in_RDX,0x272985);
    *(int *)(in_RDI + 1) = iVar2 + (int)in_RDI[1];
    *in_RSI = (ulong)in_RDX;
  }
  return;
}

Assistant:

static void sqlite3Fts5PoslistSafeAppend(
  Fts5Buffer *pBuf,
  i64 *piPrev,
  i64 iPos
){
  if( iPos>=*piPrev ){
    static const i64 colmask = ((i64)(0x7FFFFFFF)) << 32;
    if( (iPos & colmask) != (*piPrev & colmask) ){
      pBuf->p[pBuf->n++] = 1;
      pBuf->n += sqlite3Fts5PutVarint(&pBuf->p[pBuf->n], (iPos>>32));
      *piPrev = (iPos & colmask);
    }
    pBuf->n += sqlite3Fts5PutVarint(&pBuf->p[pBuf->n], (iPos-*piPrev)+2);
    *piPrev = iPos;
  }
}